

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusQFunctionPlanner.cpp
# Opt level: O2

void __thiscall PerseusQFunctionPlanner::Plan(PerseusQFunctionPlanner *this)

{
  bool bVar1;
  int iter;
  vector<double,_std::allocator<double>_> VB;
  QFunctionsDiscrete Q1;
  QFunctionsDiscrete Q0;
  vector<double,_std::allocator<double>_> VBnew;
  _Vector_base<double,_std::allocator<double>_> local_c8;
  QFunctionsDiscrete local_a8;
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  local_88;
  _Vector_base<double,_std::allocator<double>_> local_68;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  Perseus::PlanLeadIn((Perseus *)this);
  local_88.
  super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.
  super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.
  super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Perseus::GetInitialQFunctions((QFunctionsDiscrete *)&local_48,(Perseus *)this);
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::_M_move_assign(&local_a8,&local_48);
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::~vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
             *)&local_48);
  BeliefValue::GetValues
            ((vector<double,_std::allocator<double>_> *)&local_48,
             *(BeliefSet **)&(this->super_PerseusStationary).super_Perseus.field_0xc0,&local_a8);
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            ((vector<double,_std::allocator<double>_> *)&local_c8,&local_48);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  iter = 0;
  bVar1 = false;
  while (bVar1 == false) {
    Perseus::
    PlanStartOfIteration<std::vector<std::vector<AlphaVector,std::allocator<AlphaVector>>,std::allocator<std::vector<AlphaVector,std::allocator<AlphaVector>>>>>
              ((Perseus *)this,iter,(vector<double,_std::allocator<double>_> *)&local_c8,&local_a8);
    std::
    vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
    ::operator=(&local_88,&local_a8);
    (*(this->super_PerseusStationary).super_Perseus._vptr_Perseus[0xe])
              (&local_48,this,
               *(undefined8 *)&(this->super_PerseusStationary).super_Perseus.field_0xc0,&local_88);
    std::
    vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
    ::_M_move_assign(&local_a8,&local_48);
    std::
    vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
    ::~vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
               *)&local_48);
    BeliefValue::GetValues
              ((vector<double,_std::allocator<double>_> *)&local_48,
               *(BeliefSet **)&(this->super_PerseusStationary).super_Perseus.field_0xc0,&local_a8);
    std::vector<double,_std::allocator<double>_>::_M_move_assign
              ((vector<double,_std::allocator<double>_> *)&local_68,&local_48);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
    bVar1 = Perseus::CheckConvergence
                      ((Perseus *)this,(vector<double,_std::allocator<double>_> *)&local_c8,
                       (vector<double,_std::allocator<double>_> *)&local_68,iter);
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)&local_c8,
               (vector<double,_std::allocator<double>_> *)&local_68);
    iter = iter + 1;
    Perseus::
    PlanEndOfIteration<std::vector<std::vector<AlphaVector,std::allocator<AlphaVector>>,std::allocator<std::vector<AlphaVector,std::allocator<AlphaVector>>>>>
              ((Perseus *)this,&local_a8);
  }
  Perseus::PlanLeadOut((Perseus *)this);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_68);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_c8);
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::~vector(&local_a8);
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::~vector(&local_88);
  return;
}

Assistant:

void PerseusQFunctionPlanner::Plan()
{
    PlanLeadIn();

    QFunctionsDiscrete Q0,Q1;
    // records the value of each belief in the belief set
    vector<double> VB,VBnew;
    
    // get initial value function
    Q1=GetInitialQFunctions();
    VB=BeliefValue::GetValues(*_m_beliefs,Q1);

    int iter=0;                      
    bool done=false;
    while(!done)
    {
        // print out some info
        PlanStartOfIteration(iter,VB,Q1);

        // the real thing: compute the next stage value function
        Q0=Q1;
        Q1=BackupStage(*_m_beliefs,Q0);

        // compute the maximum difference in the values for all
        // beliefs: for the convergence test
        VBnew=BeliefValue::GetValues(*_m_beliefs,Q1);
       
        // test for convergence
        if(CheckConvergence(VB,VBnew,iter))
            done=true;

        VB=VBnew;
        iter++;

        PlanEndOfIteration(Q1);
    }

    PlanLeadOut();
}